

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonReturnParse(sqlite3_context *ctx,JsonParse *p)

{
  long lVar1;
  undefined4 uVar2;
  void *pvVar3;
  JsonString *in_RSI;
  JsonParse *in_RDI;
  long in_FS_OFFSET;
  int flgs;
  JsonString s;
  undefined4 in_stack_ffffffffffffff58;
  int n;
  JsonString *in_stack_ffffffffffffff70;
  JsonString *in_stack_ffffffffffffffc0;
  u32 in_stack_ffffffffffffffcc;
  JsonParse *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI->zSpace[0xd] == '\0') {
    pvVar3 = sqlite3_user_data((sqlite3_context *)in_RDI);
    uVar2 = SUB84(pvVar3,0);
    if (((ulong)pvVar3 & 8) == 0) {
      memset(&stack0xffffffffffffff70,0xaa,0x88);
      jsonStringInit(in_RSI,(sqlite3_context *)CONCAT44(uVar2,in_stack_ffffffffffffff58));
      in_RSI->zSpace[0x12] = '\0';
      in_RSI->zSpace[0x13] = '\0';
      in_RSI->zSpace[0x14] = '\0';
      in_RSI->zSpace[0x15] = '\0';
      jsonTranslateBlobToText
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
      jsonReturnString(in_stack_ffffffffffffff70,in_RDI,(sqlite3_context *)in_RSI);
      sqlite3_result_subtype((sqlite3_context *)in_RDI,0x4a);
    }
    else {
      n = (int)((ulong)in_RSI >> 0x20);
      if ((*(int *)((long)&in_RSI->zBuf + 4) == 0) || (in_RSI->zSpace[0x10] != '\0')) {
        sqlite3_result_blob((sqlite3_context *)in_stack_ffffffffffffff70,in_RDI,n,
                            (_func_void_void_ptr *)CONCAT44(uVar2,in_stack_ffffffffffffff58));
      }
      else {
        sqlite3_result_blob((sqlite3_context *)in_stack_ffffffffffffff70,in_RDI,n,
                            (_func_void_void_ptr *)CONCAT44(uVar2,in_stack_ffffffffffffff58));
        *(undefined4 *)((long)&in_RSI->zBuf + 4) = 0;
      }
    }
  }
  else {
    sqlite3_result_error_nomem((sqlite3_context *)0x2320af);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void jsonReturnParse(
  sqlite3_context *ctx,
  JsonParse *p
){
  int flgs;
  if( p->oom ){
    sqlite3_result_error_nomem(ctx);
    return;
  }
  flgs = SQLITE_PTR_TO_INT(sqlite3_user_data(ctx));
  if( flgs & JSON_BLOB ){
    if( p->nBlobAlloc>0 && !p->bReadOnly ){
      sqlite3_result_blob(ctx, p->aBlob, p->nBlob, SQLITE_DYNAMIC);
      p->nBlobAlloc = 0;
    }else{
      sqlite3_result_blob(ctx, p->aBlob, p->nBlob, SQLITE_TRANSIENT);
    }
  }else{
    JsonString s;
    jsonStringInit(&s, ctx);
    p->delta = 0;
    jsonTranslateBlobToText(p, 0, &s);
    jsonReturnString(&s, p, ctx);
    sqlite3_result_subtype(ctx, JSON_SUBTYPE);
  }
}